

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Mode __thiscall
Catch::Clara::Parser::handleOpt
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  long lVar1;
  undefined7 in_register_00000011;
  pointer pcVar2;
  string local_a0 [32];
  undefined4 *local_80;
  _Alloc_hider local_78;
  undefined4 local_70;
  undefined2 local_6c;
  string local_58 [8];
  string optName;
  
  local_80 = &local_70;
  local_70 = 0x3d3a;
  local_6c = 0;
  local_78._M_p = (pointer)0x5;
  optName.field_2._8_8_ = arg;
  lVar1 = std::__cxx11::string::find
                    ((char)(Token *)&local_80,CONCAT71(in_register_00000011,c) & 0xffffffff);
  std::__cxx11::string::~string((string *)&local_80);
  if (lVar1 == -1) {
    return this->mode;
  }
  std::__cxx11::string::substr((ulong)local_58,optName.field_2._8_8_);
  if (this->mode == SlashOpt) {
    if (optName._M_dataplus._M_p != (pointer)0x1) goto LAB_00148e8c;
    local_80 = (undefined4 *)CONCAT44(local_80._4_4_,1);
    std::__cxx11::string::string((string *)&local_78,local_58);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)&local_80);
  }
  else {
    if (this->mode == ShortOpt) {
      for (pcVar2 = (pointer)0x0; pcVar2 < optName._M_dataplus._M_p; pcVar2 = pcVar2 + 1) {
        std::__cxx11::string::substr((ulong)local_a0,(ulong)local_58);
        local_80 = (undefined4 *)CONCAT44(local_80._4_4_,1);
        std::__cxx11::string::string((string *)&local_78,local_a0);
        std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
        emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)&local_80);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string(local_a0);
      }
      goto LAB_00148eb8;
    }
LAB_00148e8c:
    local_80 = (undefined4 *)CONCAT44(local_80._4_4_,2);
    std::__cxx11::string::string((string *)&local_78,local_58);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)&local_80);
  }
  std::__cxx11::string::~string((string *)&local_78);
LAB_00148eb8:
  std::__cxx11::string::~string(local_58);
  return None;
}

Assistant:

Mode handleOpt( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( std::string( ":=\0", 5 ).find( c ) == std::string::npos )
                return mode;

            std::string optName = arg.substr( from, i-from );
            if( mode == ShortOpt )
                for( std::size_t j = 0; j < optName.size(); ++j )
                    tokens.push_back( Token( Token::ShortOpt, optName.substr( j, 1 ) ) );
            else if( mode == SlashOpt && optName.size() == 1 )
                tokens.push_back( Token( Token::ShortOpt, optName ) );
            else
                tokens.push_back( Token( Token::LongOpt, optName ) );
            return None;
        }